

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  bool bVar1;
  cmState *this_00;
  char *pcVar2;
  cmake *pcVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  string valueToUse;
  string cacheEntryName;
  string envVarValue;
  allocator local_b1;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70;
  string local_50;
  
  this = lg->Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv(envVar,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_ECLIPSE_ENVVAR_","");
  std::__cxx11::string::append((char *)&local_70);
  this_00 = cmLocalGenerator::GetState(lg);
  pcVar2 = cmState::GetInitializedCacheValue(this_00,&local_70);
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = '\0';
  if (pcVar2 == (char *)0x0 && !bVar1) {
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,0x58e58e);
    goto LAB_00352259;
  }
  if (bVar1 && pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_b0);
    cmMakefile::AddCacheDefinition(this,&local_70,local_b0,local_70._M_dataplus._M_p,STRING,true);
    pcVar3 = cmMakefile::GetCMakeInstance(this);
    pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&local_90,pcVar2,&local_b1);
    cmake::SaveCache(pcVar3,&local_90);
  }
  else {
    strlen(pcVar2);
    if (!bVar1 && pcVar2 != (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar2);
      goto LAB_00352259;
    }
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar2);
    lVar4 = std::__cxx11::string::find((char *)&local_b0,(ulong)local_50._M_dataplus._M_p,0);
    if (lVar4 != -1) goto LAB_00352259;
    std::__cxx11::string::_M_assign((string *)&local_b0);
    cmMakefile::AddCacheDefinition(this,&local_70,local_b0,local_70._M_dataplus._M_p,STRING,true);
    pcVar3 = cmMakefile::GetCMakeInstance(this);
    pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&local_90,pcVar2,&local_b1);
    cmake::SaveCache(pcVar3,&local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_00352259:
  if (local_a8 != 0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)out + (int)out->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>(out,envVar,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"=",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue =
    lg->GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && cacheValue == CM_NULLPTR) {
    // nothing known, do nothing
    valueToUse = "";
  } else if (envVarSet && cacheValue == CM_NULLPTR) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
  } else if (!envVarSet && cacheValue != CM_NULLPTR) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmStateEnums::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}